

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t restore_entry(archive_write_disk *a)

{
  int iVar1;
  wchar_t wVar2;
  int *piVar3;
  int local_24;
  wchar_t local_20;
  wchar_t r;
  wchar_t en;
  wchar_t ret;
  archive_write_disk *a_local;
  
  if (((a->flags & 0x10U) != 0) && ((a->mode & 0xf000) != 0x4000)) {
    iVar1 = unlink(a->name);
    if (iVar1 == 0) {
      a->pst = (stat_conflict *)0x0;
    }
    else {
      piVar3 = __errno_location();
      if (*piVar3 != 2) {
        iVar1 = rmdir(a->name);
        if (iVar1 != 0) {
          piVar3 = __errno_location();
          archive_set_error(&a->archive,*piVar3,"Could not unlink");
          return L'\xffffffe7';
        }
        a->pst = (stat_conflict *)0x0;
      }
    }
  }
  local_20 = create_filesystem_object(a);
  if (((local_20 == L'\x14') || (local_20 == L'\x02')) && ((a->flags & 0x400U) == 0)) {
    create_parent_dir(a,a->name);
    local_20 = create_filesystem_object(a);
  }
  if (((local_20 == L'\x15') || (local_20 == L'\x11')) && ((a->flags & 8U) != 0)) {
    archive_entry_unset_size(a->entry);
    return L'\0';
  }
  if (local_20 == L'\x15') {
    iVar1 = rmdir(a->name);
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      archive_set_error(&a->archive,*piVar3,"Can\'t remove already-existing dir");
      return L'\xffffffe7';
    }
    a->pst = (stat_conflict *)0x0;
    local_20 = create_filesystem_object(a);
  }
  else if (local_20 == L'\x11') {
    local_24 = 0;
    if ((a->mode & 0xf000) == 0x4000) {
      local_24 = stat(a->name,(stat *)&a->st);
    }
    if ((local_24 != 0) || ((a->mode & 0xf000) != 0x4000)) {
      local_24 = lstat(a->name,(stat *)&a->st);
    }
    if (local_24 != 0) {
      piVar3 = __errno_location();
      archive_set_error(&a->archive,*piVar3,"Can\'t stat existing object");
      return L'\xffffffe7';
    }
    if ((((a->flags & 0x800U) != 0) && (((a->st).st_mode & 0xf000) != 0x4000)) &&
       (wVar2 = older(&a->st,a->entry), wVar2 == L'\0')) {
      archive_entry_unset_size(a->entry);
      return L'\0';
    }
    if (((a->skip_file_set != L'\0') && ((a->st).st_dev == a->skip_file_dev)) &&
       ((a->st).st_ino == a->skip_file_ino)) {
      archive_set_error(&a->archive,0,"Refusing to overwrite archive");
      return L'\xffffffe7';
    }
    if (((a->st).st_mode & 0xf000) == 0x4000) {
      if ((a->mode & 0xf000) == 0x4000) {
        if ((a->mode != (a->st).st_mode) && ((a->todo & 0x40000000U) != 0)) {
          a->deferred = a->todo & 0x34000000U | a->deferred;
        }
        local_20 = L'\0';
      }
      else {
        iVar1 = rmdir(a->name);
        if (iVar1 != 0) {
          piVar3 = __errno_location();
          archive_set_error(&a->archive,*piVar3,
                            "Can\'t replace existing directory with non-directory");
          return L'\xffffffe7';
        }
        local_20 = create_filesystem_object(a);
      }
    }
    else {
      iVar1 = unlink(a->name);
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        archive_set_error(&a->archive,*piVar3,"Can\'t unlink already-existing object");
        return L'\xffffffe7';
      }
      a->pst = (stat_conflict *)0x0;
      local_20 = create_filesystem_object(a);
    }
  }
  if (local_20 == L'\0') {
    a->pst = (stat_conflict *)0x0;
    a_local._4_4_ = L'\0';
  }
  else {
    archive_set_error(&a->archive,local_20,"Can\'t create \'%s\'",a->name);
    a_local._4_4_ = L'\xffffffe7';
  }
  return a_local._4_4_;
}

Assistant:

static int
restore_entry(struct archive_write_disk *a)
{
	int ret = ARCHIVE_OK, en;

	if (a->flags & ARCHIVE_EXTRACT_UNLINK && !S_ISDIR(a->mode)) {
		/*
		 * TODO: Fix this.  Apparently, there are platforms
		 * that still allow root to hose the entire filesystem
		 * by unlinking a dir.  The S_ISDIR() test above
		 * prevents us from using unlink() here if the new
		 * object is a dir, but that doesn't mean the old
		 * object isn't a dir.
		 */
		if (unlink(a->name) == 0) {
			/* We removed it, reset cached stat. */
			a->pst = NULL;
		} else if (errno == ENOENT) {
			/* File didn't exist, that's just as good. */
		} else if (rmdir(a->name) == 0) {
			/* It was a dir, but now it's gone. */
			a->pst = NULL;
		} else {
			/* We tried, but couldn't get rid of it. */
			archive_set_error(&a->archive, errno,
			    "Could not unlink");
			return(ARCHIVE_FAILED);
		}
	}

	/* Try creating it first; if this fails, we'll try to recover. */
	en = create_filesystem_object(a);

	if ((en == ENOTDIR || en == ENOENT)
	    && !(a->flags & ARCHIVE_EXTRACT_NO_AUTODIR)) {
		/* If the parent dir doesn't exist, try creating it. */
		create_parent_dir(a, a->name);
		/* Now try to create the object again. */
		en = create_filesystem_object(a);
	}

	if ((en == EISDIR || en == EEXIST)
	    && (a->flags & ARCHIVE_EXTRACT_NO_OVERWRITE)) {
		/* If we're not overwriting, we're done. */
		archive_entry_unset_size(a->entry);
		return (ARCHIVE_OK);
	}

	/*
	 * Some platforms return EISDIR if you call
	 * open(O_WRONLY | O_EXCL | O_CREAT) on a directory, some
	 * return EEXIST.  POSIX is ambiguous, requiring EISDIR
	 * for open(O_WRONLY) on a dir and EEXIST for open(O_EXCL | O_CREAT)
	 * on an existing item.
	 */
	if (en == EISDIR) {
		/* A dir is in the way of a non-dir, rmdir it. */
		if (rmdir(a->name) != 0) {
			archive_set_error(&a->archive, errno,
			    "Can't remove already-existing dir");
			return (ARCHIVE_FAILED);
		}
		a->pst = NULL;
		/* Try again. */
		en = create_filesystem_object(a);
	} else if (en == EEXIST) {
		/*
		 * We know something is in the way, but we don't know what;
		 * we need to find out before we go any further.
		 */
		int r = 0;
		/*
		 * The SECURE_SYMLINKS logic has already removed a
		 * symlink to a dir if the client wants that.  So
		 * follow the symlink if we're creating a dir.
		 */
		if (S_ISDIR(a->mode))
			r = stat(a->name, &a->st);
		/*
		 * If it's not a dir (or it's a broken symlink),
		 * then don't follow it.
		 */
		if (r != 0 || !S_ISDIR(a->mode))
			r = lstat(a->name, &a->st);
		if (r != 0) {
			archive_set_error(&a->archive, errno,
			    "Can't stat existing object");
			return (ARCHIVE_FAILED);
		}

		/*
		 * NO_OVERWRITE_NEWER doesn't apply to directories.
		 */
		if ((a->flags & ARCHIVE_EXTRACT_NO_OVERWRITE_NEWER)
		    &&  !S_ISDIR(a->st.st_mode)) {
			if (!older(&(a->st), a->entry)) {
				archive_entry_unset_size(a->entry);
				return (ARCHIVE_OK);
			}
		}

		/* If it's our archive, we're done. */
		if (a->skip_file_set &&
		    a->st.st_dev == (dev_t)a->skip_file_dev &&
		    a->st.st_ino == (ino_t)a->skip_file_ino) {
			archive_set_error(&a->archive, 0,
			    "Refusing to overwrite archive");
			return (ARCHIVE_FAILED);
		}

		if (!S_ISDIR(a->st.st_mode)) {
			/* A non-dir is in the way, unlink it. */
			if (unlink(a->name) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't unlink already-existing object");
				return (ARCHIVE_FAILED);
			}
			a->pst = NULL;
			/* Try again. */
			en = create_filesystem_object(a);
		} else if (!S_ISDIR(a->mode)) {
			/* A dir is in the way of a non-dir, rmdir it. */
			if (rmdir(a->name) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't replace existing directory with non-directory");
				return (ARCHIVE_FAILED);
			}
			/* Try again. */
			en = create_filesystem_object(a);
		} else {
			/*
			 * There's a dir in the way of a dir.  Don't
			 * waste time with rmdir()/mkdir(), just fix
			 * up the permissions on the existing dir.
			 * Note that we don't change perms on existing
			 * dirs unless _EXTRACT_PERM is specified.
			 */
			if ((a->mode != a->st.st_mode)
			    && (a->todo & TODO_MODE_FORCE))
				a->deferred |= (a->todo & TODO_MODE);
			/* Ownership doesn't need deferred fixup. */
			en = 0; /* Forget the EEXIST. */
		}
	}

	if (en) {
		/* Everything failed; give up here. */
		archive_set_error(&a->archive, en, "Can't create '%s'",
		    a->name);
		return (ARCHIVE_FAILED);
	}

	a->pst = NULL; /* Cached stat data no longer valid. */
	return (ret);
}